

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS ref_node_tri_normal(REF_NODE ref_node,REF_INT *nodes,REF_DBL *normal)

{
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL *xyz2;
  REF_DBL *xyz1;
  REF_DBL *xyz0;
  REF_DBL *normal_local;
  REF_INT *nodes_local;
  REF_NODE ref_node_local;
  
  if ((((((*nodes < 0) || (ref_node->max <= *nodes)) || (ref_node->global[*nodes] < 0)) ||
       ((nodes[1] < 0 || (ref_node->max <= nodes[1])))) ||
      ((ref_node->global[nodes[1]] < 0 || ((nodes[2] < 0 || (ref_node->max <= nodes[2])))))) ||
     (ref_node->global[nodes[2]] < 0)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x8d7,
           "ref_node_tri_normal",3,"node invalid");
    ref_node_local._4_4_ = 3;
  }
  else {
    ref_node_local._4_4_ =
         ref_node_xyz_normal(ref_node->real + *nodes * 0xf,ref_node->real + nodes[1] * 0xf,
                             ref_node->real + nodes[2] * 0xf,normal);
    if (ref_node_local._4_4_ == 0) {
      ref_node_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x8dd,
             "ref_node_tri_normal",(ulong)ref_node_local._4_4_,"xyz norm");
    }
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_node_tri_normal(REF_NODE ref_node, REF_INT *nodes,
                                       REF_DBL *normal) {
  REF_DBL *xyz0, *xyz1, *xyz2;

  if (!ref_node_valid(ref_node, nodes[0]) ||
      !ref_node_valid(ref_node, nodes[1]) ||
      !ref_node_valid(ref_node, nodes[2]))
    RSS(REF_INVALID, "node invalid");

  xyz0 = ref_node_xyz_ptr(ref_node, nodes[0]);
  xyz1 = ref_node_xyz_ptr(ref_node, nodes[1]);
  xyz2 = ref_node_xyz_ptr(ref_node, nodes[2]);

  RSS(ref_node_xyz_normal(xyz0, xyz1, xyz2, normal), "xyz norm");

  return REF_SUCCESS;
}